

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conv.cc
# Opt level: O3

void __thiscall
cnn::FoldRows::forward_impl
          (FoldRows *this,vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *xs,
          Tensor *fx)

{
  float fVar1;
  uint uVar2;
  uint uVar3;
  float *pfVar4;
  ulong uVar5;
  variable_if_dynamic<long,__1> vVar6;
  float *pfVar7;
  long lVar8;
  int iVar9;
  ulong uVar10;
  uint uVar11;
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> y;
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> x;
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> local_118;
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> local_f8;
  ulong local_d8;
  MapBase<Eigen::Block<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1,__1,_false>,_1>
  local_d0;
  long local_a8;
  ulong local_98;
  undefined8 local_90;
  undefined8 local_88;
  MapBase<Eigen::Block<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1,__1,_false>,_1>
  local_80;
  PointerType local_68;
  long lStack_60;
  long local_58;
  ulong local_48;
  undefined8 local_40;
  undefined8 local_38;
  
  Tensor::operator*(&local_f8,
                    *(xs->
                     super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>).
                     _M_impl.super__Vector_impl_data._M_start);
  Tensor::operator*(&local_118,fx);
  local_d8 = (ulong)(uint)local_118.
                          super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                          .
                          super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                          .m_rows.m_value;
  if (local_d8 != 0) {
    uVar2 = this->nrows;
    lVar8 = 0;
    uVar10 = 0;
    uVar3 = uVar2;
    do {
      if (uVar3 == 0) {
        uVar3 = 0;
      }
      else {
        uVar11 = 0;
        do {
          iVar9 = (int)uVar10;
          if (uVar11 == 0) {
            uVar5 = (ulong)(uVar3 * iVar9);
            local_80.
            super_MapBase<Eigen::Block<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1,__1,_false>,_0>
            .m_data = local_f8.
                      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                      .
                      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                      .m_data + uVar5;
            local_80.
            super_MapBase<Eigen::Block<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1,__1,_false>,_0>
            .m_cols.m_value =
                 local_f8.
                 super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                 .
                 super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                 .m_cols.m_value;
            if (local_f8.
                super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                .
                super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                .m_cols.m_value < 0 &&
                local_f8.
                super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                .
                super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                .m_data != (PointerType)0x0) goto LAB_0022f1b7;
            local_58 = local_f8.
                       super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                       .
                       super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                       .m_cols.m_value;
            local_68 = local_f8.
                       super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                       .
                       super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                       .m_data;
            lStack_60 = local_f8.
                        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                        .
                        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                        .m_rows.m_value;
            local_40 = 0;
            local_38 = 1;
            local_48 = uVar5;
            if (local_f8.
                super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                .
                super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                .m_rows.m_value <= (long)uVar5) goto LAB_0022f1d6;
            local_d0.
            super_MapBase<Eigen::Block<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1,__1,_false>,_0>
            .m_data = local_118.
                      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                      .
                      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                      .m_data + uVar10;
            local_d0.
            super_MapBase<Eigen::Block<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1,__1,_false>,_0>
            .m_cols.m_value =
                 local_118.
                 super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                 .
                 super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                 .m_cols.m_value;
            if (local_118.
                super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                .
                super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                .m_cols.m_value < 0 &&
                local_118.
                super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                .
                super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                .m_data != (PointerType)0x0) goto LAB_0022f1b7;
            local_a8 = local_118.
                       super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                       .
                       super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                       .m_cols.m_value;
            local_90 = 0;
            local_88 = 1;
            local_98 = uVar10;
            if (CONCAT44(local_118.
                         super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                         .
                         super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                         .m_rows.m_value._4_4_,
                         (uint)local_118.
                               super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                               .
                               super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                               .m_rows.m_value) <= (long)uVar10) goto LAB_0022f1d6;
            Eigen::
            MapBase<Eigen::Block<Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>,_1,_-1,_false>,_1>
            ::operator=(&local_d0,&local_80);
            uVar2 = this->nrows;
          }
          else {
            if (local_f8.
                super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                .
                super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                .m_cols.m_value < 0 &&
                local_f8.
                super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                .
                super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                .m_data != (PointerType)0x0) {
LAB_0022f1b7:
              __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                            ,"/usr/include/eigen3/Eigen/src/Core/MapBase.h",0xb2,
                            "Eigen::MapBase<Eigen::Block<Eigen::Map<Eigen::Matrix<float, -1, -1>>, 1>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<Eigen::Map<Eigen::Matrix<float, -1, -1>>, 1>, Level = 0]"
                           );
            }
            if (local_f8.
                super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                .
                super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                .m_rows.m_value <= (long)(ulong)(uVar3 * iVar9 + uVar11)) {
LAB_0022f1d6:
              __assert_fail("(i>=0) && ( ((BlockRows==1) && (BlockCols==XprType::ColsAtCompileTime) && i<xpr.rows()) ||((BlockRows==XprType::RowsAtCompileTime) && (BlockCols==1) && i<xpr.cols()))"
                            ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x7a,
                            "Eigen::Block<Eigen::Map<Eigen::Matrix<float, -1, -1>>, 1>::Block(XprType &, Index) [XprType = Eigen::Map<Eigen::Matrix<float, -1, -1>>, BlockRows = 1, BlockCols = -1, InnerPanel = false]"
                           );
            }
            if (local_118.
                super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                .
                super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                .m_cols.m_value < 0 &&
                local_118.
                super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                .
                super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                .m_data != (PointerType)0x0) goto LAB_0022f1b7;
            if (CONCAT44(local_118.
                         super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                         .
                         super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                         .m_rows.m_value._4_4_,
                         (uint)local_118.
                               super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                               .
                               super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                               .m_rows.m_value) <= (long)uVar10) goto LAB_0022f1d6;
            if (local_118.
                super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                .
                super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                .m_cols.m_value !=
                local_f8.
                super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                .
                super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                .m_cols.m_value) {
              __assert_fail("dst.rows() == src.rows() && dst.cols() == src.cols()",
                            "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2f2,
                            "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const Functor &) [DstXprType = Eigen::Block<Eigen::Map<Eigen::Matrix<float, -1, -1>>, 1>, SrcXprType = Eigen::Block<Eigen::Map<Eigen::Matrix<float, -1, -1>>, 1>, Functor = Eigen::internal::add_assign_op<float, float>]"
                           );
            }
            if (0 < local_f8.
                    super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                    .
                    super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                    .m_cols.m_value) {
              pfVar7 = (float *)((long)local_118.
                                       super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                                       .
                                       super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                                       .m_data + lVar8);
              pfVar4 = local_f8.
                       super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                       .
                       super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                       .m_data + (uVar3 * iVar9 + uVar11);
              vVar6.m_value =
                   local_f8.
                   super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                   .
                   super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                   .m_cols.m_value;
              do {
                fVar1 = *pfVar4;
                pfVar4 = pfVar4 + local_f8.
                                  super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                                  .
                                  super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                                  .m_rows.m_value;
                *pfVar7 = *pfVar7 + fVar1;
                pfVar7 = pfVar7 + CONCAT44(local_118.
                                           super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                                           .
                                           super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                                           .m_rows.m_value._4_4_,
                                           (uint)local_118.
                                                 super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                                                 .
                                                 super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                                                 .m_rows.m_value);
                vVar6.m_value = vVar6.m_value + -1;
              } while (vVar6.m_value != 0);
            }
          }
          uVar11 = uVar11 + 1;
          uVar3 = uVar2;
        } while (uVar11 < uVar2);
      }
      uVar10 = uVar10 + 1;
      lVar8 = lVar8 + 4;
    } while (uVar10 != local_d8);
  }
  return;
}

Assistant:

void FoldRows::forward_impl(const vector<const Tensor*>& xs, Tensor& fx) const {
#ifdef HAVE_CUDA
  throw std::runtime_error("FoldRows::forward not implemented for CUDA");
#else
  auto x = **xs[0];
  auto y = *fx;
  unsigned orows = y.rows();
  for (unsigned i = 0; i < orows; ++i) {
    for (unsigned j = 0; j < nrows; ++j) {
      if (j)
        y.row(i) += x.row(i * nrows + j);
      else // j = 0
        y.row(i) = x.row(i * nrows);
    }
  }
#endif
}